

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

void cmd_ln_log_help_r(ps_config_t *cmdln,ps_arg_t *defn)

{
  cmd_ln_t *cmdln_00;
  int32 iVar1;
  
  if (defn == (ps_arg_t *)0x0) {
    return;
  }
  iVar1 = 0x1126e2;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
          ,0x22a,"Arguments list definition:\n");
  if (cmdln != (ps_config_t *)0x0) {
    arg_log_r(cmdln,defn,1,iVar1);
    return;
  }
  iVar1 = 0;
  cmdln_00 = cmd_ln_parse_r((ps_config_t *)0x0,defn,0,(char **)0x0,0);
  arg_log_r(cmdln_00,defn,1,iVar1);
  ps_config_free(cmdln_00);
  return;
}

Assistant:

void
cmd_ln_log_help_r(ps_config_t *cmdln, ps_arg_t const* defn)
{
    if (defn == NULL)
        return;
    E_INFO("Arguments list definition:\n");
    if (cmdln == NULL) {
        cmdln = cmd_ln_parse_r(NULL, defn, 0, NULL, FALSE);
        arg_log_r(cmdln, defn, TRUE, FALSE);
        ps_config_free(cmdln);
    }
    else
        arg_log_r(cmdln, defn, TRUE, FALSE);
}